

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_dds_internal
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  crn_uint32 cVar1;
  data_stream_serializer *pdVar2;
  bool bVar3;
  uint uVar4;
  component_flags cVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *p;
  vector<crnlib::mip_level_*> *pvVar9;
  mip_level *this_00;
  mip_level **ppmVar10;
  dxt_image *this_01;
  element_vec *this_02;
  element *peVar11;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_03;
  image<crnlib::color_quad<unsigned_char,_int>_> *p_00;
  uchar *puVar12;
  size_t in_RCX;
  size_t sVar13;
  uint *init1;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_25c;
  uint local_220;
  uint v;
  uint bits;
  uint mask;
  uint i;
  uint l;
  uint c;
  uint8 *pPixel;
  color_quad<unsigned_char,_int> *pcStack_178;
  uint x;
  color_quad_u8 *pDst;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_168;
  uint y;
  color_quad_u8 q;
  uint line_pitch;
  uint actual_line_pitch;
  uint bytes_per_pixel;
  image_u8 *pImage;
  dxt_image *pDXTImage;
  uint level_pitch;
  uint actual_level_pitch;
  uint num_blocks_y;
  uint num_blocks_x;
  uint bytes_per_block;
  mip_level *pMip;
  uint local_118;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  uint uStack_104;
  bool dxt1_alpha;
  uint mask_ofs [4];
  uint mask_size [4];
  vector<unsigned_char> load_buf;
  uint pitch;
  uint default_pitch;
  uint bits_per_pixel;
  undefined1 local_c0 [8];
  dynamic_string err_msg;
  dxt_format dxt_fmt;
  uint all_faces_mask;
  uint num_faces;
  uint num_mip_levels;
  DDSURFACEDESC2 desc;
  uint8 hdr [4];
  data_stream_serializer *serializer_local;
  mipmapped_texture *this_local;
  
  unique0x10000942 = serializer;
  clear(this);
  set_last_error(this,"Not a DDS file");
  uVar8 = data_stream_serializer::read(stack0xffffffffffffffe0,(int)&desc + 0x74,(void *)0x4,in_RCX)
  ;
  if ((uVar8 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if (desc.ddsCaps.dwCaps4 == 0x20534444) {
    uVar8 = data_stream_serializer::read
                      (stack0xffffffffffffffe0,(int)&num_faces,(void *)0x7c,in_RCX);
    if ((uVar8 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else if (num_faces == 0x7c) {
      if ((((desc.dwSize == 0) || (desc.dwFlags == 0)) || (0x2000 < desc.dwSize)) ||
         (0x2000 < desc.dwFlags)) {
        this_local._7_1_ = false;
      }
      else {
        this->m_width = desc.dwFlags;
        this->m_height = desc.dwSize;
        all_faces_mask = 1;
        if ((((num_mip_levels & 0x20000) != 0) &&
            ((desc.ddpfPixelFormat.dwBBitMask & 0x400000) != 0)) && (desc.field_4.lPitch != 0)) {
          all_faces_mask = desc.field_4.dwLinearSize;
          uVar4 = utils::compute_max_mips(desc.dwFlags,desc.dwSize);
          if (uVar4 < desc.field_4.dwLinearSize) {
            return false;
          }
        }
        dxt_fmt = cDXT1A;
        if ((desc.ddpfPixelFormat.dwBBitMask & 8) != 0) {
          if ((desc.ddpfPixelFormat.dwRGBAlphaBitMask & 0x200) == 0) {
            if ((desc.ddpfPixelFormat.dwRGBAlphaBitMask & 0x200000) != 0) {
              set_last_error(this,"Volume textures unsupported");
              return false;
            }
          }
          else {
            err_msg.m_pStr._4_4_ = 0xfc00;
            if ((desc.ddpfPixelFormat.dwRGBAlphaBitMask & 0xfc00) != 0xfc00) {
              set_last_error(this,"Incomplete cubemaps unsupported");
              return false;
            }
            dxt_fmt = cDXN_YX;
          }
        }
        if ((desc.unused3.dwUnused1 & 0x20) == 0) {
          err_msg.m_pStr._0_4_ = 0xffffffff;
          if ((desc.unused3.dwUnused1 & 4) == 0) {
            if (((desc.ddpfPixelFormat.dwFlags < 8) || (0x20 < desc.ddpfPixelFormat.dwFlags)) ||
               ((desc.ddpfPixelFormat.dwFlags & 7) != 0)) {
              set_last_error(this,"Unsupported bit count");
              return false;
            }
            if ((desc.unused3.dwUnused1 & 0x40) == 0) {
              if ((desc.unused3.dwUnused1 & 1) == 0) {
                if ((desc.unused3.dwUnused1 & 0x20000) == 0) {
                  if ((desc.unused3.dwUnused1 & 2) == 0) {
                    set_last_error(this,"Unsupported format");
                    return false;
                  }
                  this->m_format = PIXEL_FMT_A8;
                }
                else {
                  this->m_format = PIXEL_FMT_L8;
                }
              }
              else if ((desc.unused3.dwUnused1 & 0x20000) == 0) {
                this->m_format = PIXEL_FMT_A8;
              }
              else {
                this->m_format = PIXEL_FMT_A8L8;
              }
            }
            else if ((desc.unused3.dwUnused1 & 0x20000) == 0) {
              if ((desc.unused3.dwUnused1 & 1) == 0) {
                this->m_format = PIXEL_FMT_R8G8B8;
              }
              else {
                this->m_format = PIXEL_FMT_A8R8G8B8;
              }
            }
            else if ((desc.unused3.dwUnused1 & 1) == 0) {
              this->m_format = PIXEL_FMT_L8;
            }
            else {
              this->m_format = PIXEL_FMT_A8L8;
            }
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x31435445) {
            this->m_format = PIXEL_FMT_ETC1;
            err_msg.m_pStr._0_4_ = 7;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x31495441) {
            this->m_format = PIXEL_FMT_DXT5A;
            err_msg.m_pStr._0_4_ = 4;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x31545844) {
            this->m_format = PIXEL_FMT_DXT1;
            err_msg.m_pStr._0_4_ = 0;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x32435445) {
            this->m_format = PIXEL_FMT_ETC2;
            err_msg.m_pStr._0_4_ = 8;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x32495441) {
            if (desc.ddpfPixelFormat.dwFlags == 0x59583241) {
              err_msg.m_pStr._0_4_ = 5;
              this->m_format = PIXEL_FMT_DXN;
            }
            else {
              err_msg.m_pStr._0_4_ = 6;
              this->m_format = PIXEL_FMT_3DC;
            }
          }
          else if ((desc.ddpfPixelFormat.dwSize == 0x32545844) ||
                  (desc.ddpfPixelFormat.dwSize == 0x33545844)) {
            this->m_format = PIXEL_FMT_DXT3;
            err_msg.m_pStr._0_4_ = 2;
          }
          else if ((desc.ddpfPixelFormat.dwSize == 0x34545844) ||
                  (desc.ddpfPixelFormat.dwSize == 0x35545844)) {
            if (desc.ddpfPixelFormat.dwFlags == 0x52424741) {
              this->m_format = PIXEL_FMT_DXT5_AGBR;
            }
            else if (desc.ddpfPixelFormat.dwFlags == 0x52424778) {
              this->m_format = PIXEL_FMT_DXT5_xGBR;
            }
            else if (desc.ddpfPixelFormat.dwFlags == 0x52784778) {
              this->m_format = PIXEL_FMT_DXT5_xGxR;
            }
            else if (desc.ddpfPixelFormat.dwFlags == 0x59784343) {
              this->m_format = PIXEL_FMT_DXT5_CCxY;
            }
            else {
              this->m_format = PIXEL_FMT_DXT5;
            }
            err_msg.m_pStr._0_4_ = 3;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x41325445) {
            this->m_format = PIXEL_FMT_ETC2A;
            err_msg.m_pStr._0_4_ = 9;
          }
          else if (desc.ddpfPixelFormat.dwSize == 0x53315445) {
            this->m_format = PIXEL_FMT_ETC1S;
            err_msg.m_pStr._0_4_ = 10;
          }
          else {
            if (desc.ddpfPixelFormat.dwSize != 0x53413245) {
              dynamic_string::dynamic_string
                        ((dynamic_string *)local_c0,cVarArg,"Unsupported DDS FOURCC format: 0x%08X",
                         (ulong)desc.ddpfPixelFormat.dwSize);
              p = dynamic_string::get_ptr((dynamic_string *)local_c0);
              set_last_error(this,p);
              dynamic_string::~dynamic_string((dynamic_string *)local_c0);
              return false;
            }
            this->m_format = PIXEL_FMT_ETC2AS;
            err_msg.m_pStr._0_4_ = 0xb;
          }
          cVar5 = pixel_format_helpers::get_component_flags(this->m_format);
          this->m_comp_flags = cVar5;
          pitch = desc.ddpfPixelFormat.dwFlags;
          if ((desc.unused3.dwUnused1 & 4) != 0) {
            pitch = pixel_format_helpers::get_bpp(this->m_format);
          }
          set_last_error(this,"Load failed");
          cVar1 = desc.dwFlags;
          if ((desc.unused3.dwUnused1 & 4) != 0) {
            cVar1 = (desc.dwFlags + 3 & 0xfffffffc) * (desc.dwSize + 3 & 0xfffffffc);
          }
          load_buf.m_capacity = cVar1 * pitch >> 3;
          load_buf.m_size = 0;
          if (((num_mip_levels & 8) != 0) && ((num_mip_levels & 0x80000) == 0)) {
            load_buf.m_size = desc.dwHeight;
          }
          if (load_buf.m_size == 0) {
            load_buf.m_size = load_buf.m_capacity;
          }
          else if (load_buf.m_capacity << 3 < load_buf.m_size) {
            set_last_error(this,"Invalid pitch");
            return false;
          }
          vector<unsigned_char>::vector((vector<unsigned_char> *)(mask_size + 2));
          mask_ofs[2] = math::bitmask_size(desc.ddpfPixelFormat.dwFourCC);
          mask_ofs[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBBitCount);
          mask_size[0] = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
          mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
          face_index = math::bitmask_ofs(desc.ddpfPixelFormat.dwFourCC);
          uStack_104 = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBBitCount);
          mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
          mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
          if ((((desc.unused3.dwUnused1 & 0x20000) != 0) && (mask_ofs[2] == 0)) &&
             (mask_ofs[2] = desc.ddpfPixelFormat.dwFlags >> 3, (desc.unused3.dwUnused1 & 1) != 0)) {
            mask_ofs[2] = desc.ddpfPixelFormat.dwFlags >> 4;
          }
          vector<crnlib::vector<crnlib::mip_level_*>_>::resize(&this->m_faces,dxt_fmt,false);
          level_index._3_1_ = 0;
          for (width = 0; width < (uint)dxt_fmt; width = width + 1) {
            pvVar9 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,width);
            vector<crnlib::mip_level_*>::resize(pvVar9,all_faces_mask,false);
            for (height = 0; height < all_faces_mask; height = height + 1) {
              local_118 = math::maximum<unsigned_int>(desc.dwFlags >> ((byte)height & 0x1f),1);
              pMip._4_4_ = math::maximum<unsigned_int>(desc.dwSize >> ((byte)height & 0x1f),1);
              this_00 = crnlib_new<crnlib::mip_level>();
              pvVar9 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                 (&this->m_faces,width);
              ppmVar10 = vector<crnlib::mip_level_*>::operator[](pvVar9,height);
              *ppmVar10 = this_00;
              if ((desc.unused3.dwUnused1 & 4) == 0) {
                this_03 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                                    ((crnlib *)&local_118,(uint *)((long)&pMip + 4),init1);
                image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                          (this_03,this->m_comp_flags);
                uVar6 = desc.ddpfPixelFormat.dwFlags >> 3;
                q.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                            (local_118 * uVar6);
                local_25c.m_u32 = (uint32)q.field_0;
                if (height == 0) {
                  local_25c.m_u32 = load_buf.m_size;
                }
                y = local_25c.m_u32;
                uVar4 = vector<unsigned_char>::size((vector<unsigned_char> *)(mask_size + 2));
                if (uVar4 < y) {
                  vector<unsigned_char>::resize((vector<unsigned_char> *)(mask_size + 2),y,false);
                }
                sVar13 = 0;
                color_quad<unsigned_char,_int>::color_quad
                          ((color_quad<unsigned_char,_int> *)&local_168.field_0,0,0,0,0xff);
                for (pDst._4_4_ = 0; pdVar2 = stack0xffffffffffffffe0, pDst._4_4_ < pMip._4_4_;
                    pDst._4_4_ = pDst._4_4_ + 1) {
                  p_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                         vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)(mask_size + 2),0);
                  uVar8 = data_stream_serializer::read(pdVar2,(int)p_00,(void *)(ulong)y,sVar13);
                  if ((uVar8 & 1) == 0) {
                    crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                              ((crnlib *)this_03,p_00);
                    this_local._7_1_ = false;
                    goto LAB_0014953e;
                  }
                  pcStack_178 = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline
                                          (this_03,pDst._4_4_);
                  for (pPixel._4_4_ = 0; pPixel._4_4_ < local_118; pPixel._4_4_ = pPixel._4_4_ + 1)
                  {
                    puVar12 = vector<unsigned_char>::operator[]
                                        ((vector<unsigned_char> *)(mask_size + 2),
                                         pPixel._4_4_ * uVar6);
                    i = 0;
                    for (mask = 0; mask < uVar6; mask = mask + 1) {
                      sVar13 = (size_t)(mask << 3);
                      i = (uint)puVar12[mask] << ((byte)(mask << 3) & 0x1f) | i;
                    }
                    for (bits = 0; bits < 4; bits = bits + 1) {
                      if (mask_ofs[(ulong)bits + 2] != 0) {
                        uVar7 = (1 << ((byte)mask_ofs[(ulong)bits + 2] & 0x1f)) - 1;
                        sVar13 = (size_t)uVar7;
                        color_quad<unsigned_char,_int>::set_component
                                  ((color_quad<unsigned_char,_int> *)&local_168.field_0,bits,
                                   ((i >> ((byte)(&face_index)[bits] & 0x1f) & uVar7) * 0xff +
                                   (uVar7 >> 1)) / uVar7);
                      }
                    }
                    if ((desc.unused3.dwUnused1 & 0x20000) != 0) {
                      local_168.field_0.g = local_168.field_0.r;
                      local_168.field_0.b = local_168.field_0.r;
                    }
                    color_quad<unsigned_char,_int>::operator=
                              (pcStack_178,(color_quad<unsigned_char,_int> *)&local_168.field_0);
                    pcStack_178 = pcStack_178 + 1;
                  }
                }
                mip_level::assign(this_00,this_03,this->m_format,cDefaultOrientationFlags);
              }
              else {
                uVar4 = pixel_format_helpers::get_dxt_bytes_per_block(this->m_format);
                uVar6 = (local_118 + 3 >> 2) * (pMip._4_4_ + 3 >> 2) * uVar4;
                local_220 = uVar6;
                if (height == 0) {
                  local_220 = load_buf.m_size;
                }
                this_01 = crnlib_new<crnlib::dxt_image>();
                sVar13 = (size_t)pMip._4_4_;
                uVar7 = dxt_image::init(this_01,(EVP_PKEY_CTX *)(ulong)(uint)err_msg.m_pStr);
                pdVar2 = stack0xffffffffffffffe0;
                if ((uVar7 & 1) == 0) {
                  crnlib_delete<crnlib::dxt_image>(this_01);
                  this_local._7_1_ = false;
                  goto LAB_0014953e;
                }
                this_02 = dxt_image::get_element_vec(this_01);
                peVar11 = vector<crnlib::dxt_image::element>::operator[](this_02,0);
                uVar8 = data_stream_serializer::read
                                  (pdVar2,(int)peVar11,(void *)(ulong)uVar6,sVar13);
                if ((uVar8 & 1) == 0) {
                  crnlib_delete<crnlib::dxt_image>(this_01);
                  this_local._7_1_ = false;
                  goto LAB_0014953e;
                }
                if ((uVar6 < local_220) &&
                   (bVar3 = data_stream_serializer::skip(stack0xffffffffffffffe0,local_220 - uVar6),
                   !bVar3)) {
                  crnlib_delete<crnlib::dxt_image>(this_01);
                  this_local._7_1_ = false;
                  goto LAB_0014953e;
                }
                if ((this->m_format == PIXEL_FMT_DXT1) && ((level_index._3_1_ & 1) == 0)) {
                  level_index._3_1_ = dxt_image::has_alpha(this_01);
                }
                mip_level::assign(this_00,this_01,this->m_format,cDefaultOrientationFlags);
              }
            }
          }
          clear_last_error(this);
          if ((level_index._3_1_ & 1) != 0) {
            change_dxt1_to_dxt1a(this);
          }
          this_local._7_1_ = true;
LAB_0014953e:
          vector<unsigned_char>::~vector((vector<unsigned_char> *)(mask_size + 2));
        }
        else {
          set_last_error(this,"Palettized textures unsupported");
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::read_dds_internal(data_stream_serializer& serializer) {
  CRNLIB_ASSERT(serializer.get_little_endian());

  clear();

  set_last_error("Not a DDS file");

  uint8 hdr[4];
  if (!serializer.read(hdr, sizeof(hdr)))
    return false;

  if (memcmp(hdr, "DDS ", 4) != 0)
    return false;

  DDSURFACEDESC2 desc;
  if (!serializer.read(&desc, sizeof(desc)))
    return false;

  if (!c_crnlib_little_endian_platform)
    utils::endian_switch_dwords(reinterpret_cast<uint32*>(&desc), sizeof(desc) / sizeof(uint32));

  if (desc.dwSize != sizeof(desc))
    return false;

  if ((!desc.dwHeight) || (!desc.dwWidth) || (desc.dwHeight > cDDSMaxImageDimensions) || (desc.dwWidth > cDDSMaxImageDimensions))
    return false;

  m_width = desc.dwWidth;
  m_height = desc.dwHeight;

  uint num_mip_levels = 1;

  if ((desc.dwFlags & DDSD_MIPMAPCOUNT) && (desc.ddsCaps.dwCaps & DDSCAPS_MIPMAP) && (desc.dwMipMapCount)) {
    num_mip_levels = desc.dwMipMapCount;
    if (num_mip_levels > utils::compute_max_mips(desc.dwWidth, desc.dwHeight))
      return false;
  }

  uint num_faces = 1;

  if (desc.ddsCaps.dwCaps & DDSCAPS_COMPLEX) {
    if (desc.ddsCaps.dwCaps2 & DDSCAPS2_CUBEMAP) {
      const uint all_faces_mask = DDSCAPS2_CUBEMAP_POSITIVEX | DDSCAPS2_CUBEMAP_NEGATIVEX | DDSCAPS2_CUBEMAP_POSITIVEY | DDSCAPS2_CUBEMAP_NEGATIVEY | DDSCAPS2_CUBEMAP_POSITIVEZ | DDSCAPS2_CUBEMAP_NEGATIVEZ;
      if ((desc.ddsCaps.dwCaps2 & all_faces_mask) != all_faces_mask) {
        set_last_error("Incomplete cubemaps unsupported");
        return false;
      }

      num_faces = 6;
    } else if (desc.ddsCaps.dwCaps2 & DDSCAPS2_VOLUME) {
      set_last_error("Volume textures unsupported");
      return false;
    }
  }

  if (desc.ddpfPixelFormat.dwFlags & DDPF_PALETTEINDEXED8) {
    // It's difficult to even make P8 textures with existing tools:
    // nvdxt just hangs
    // dxtex.exe just makes all-white textures
    // So screw it.
    set_last_error("Palettized textures unsupported");
    return false;
  }

  dxt_format dxt_fmt = cDXTInvalid;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
    // http://code.google.com/p/nvidia-texture-tools/issues/detail?id=41
    // ATI2 YX:            0 (0x00000000)
    // ATI2 XY:   1498952257 (0x59583241) (BC5)
    // ATI Compressonator obeys this stuff, nvidia's tools (like readdxt) don't - oh great

    switch (desc.ddpfPixelFormat.dwFourCC) {
      case PIXEL_FMT_DXT1: {
        m_format = PIXEL_FMT_DXT1;
        dxt_fmt = cDXT1;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        m_format = PIXEL_FMT_DXT3;
        dxt_fmt = cDXT3;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5: {
        switch (desc.ddpfPixelFormat.dwRGBBitCount) {
          case PIXEL_FMT_DXT5_CCxY:
            m_format = PIXEL_FMT_DXT5_CCxY;
            break;
          case PIXEL_FMT_DXT5_xGxR:
            m_format = PIXEL_FMT_DXT5_xGxR;
            break;
          case PIXEL_FMT_DXT5_xGBR:
            m_format = PIXEL_FMT_DXT5_xGBR;
            break;
          case PIXEL_FMT_DXT5_AGBR:
            m_format = PIXEL_FMT_DXT5_AGBR;
            break;
          default:
            m_format = PIXEL_FMT_DXT5;
            break;
        }

        dxt_fmt = cDXT5;
        break;
      }
      case PIXEL_FMT_3DC: {
        if (desc.ddpfPixelFormat.dwRGBBitCount == CRNLIB_PIXEL_FMT_FOURCC('A', '2', 'X', 'Y')) {
          dxt_fmt = cDXN_XY;
          m_format = PIXEL_FMT_DXN;
        } else {
          dxt_fmt = cDXN_YX;  // aka ATI2
          m_format = PIXEL_FMT_3DC;
        }

        break;
      }
      case PIXEL_FMT_DXT5A: {
        m_format = PIXEL_FMT_DXT5A;
        dxt_fmt = cDXT5A;
        break;
      }
      case PIXEL_FMT_ETC1: {
        m_format = PIXEL_FMT_ETC1;
        dxt_fmt = cETC1;
        break;
      }
      case PIXEL_FMT_ETC2: {
        m_format = PIXEL_FMT_ETC2;
        dxt_fmt = cETC2;
        break;
      }
      case PIXEL_FMT_ETC2A: {
        m_format = PIXEL_FMT_ETC2A;
        dxt_fmt = cETC2A;
        break;
      }
      case PIXEL_FMT_ETC1S: {
        m_format = PIXEL_FMT_ETC1S;
        dxt_fmt = cETC1S;
        break;
      }
      case PIXEL_FMT_ETC2AS: {
        m_format = PIXEL_FMT_ETC2AS;
        dxt_fmt = cETC2AS;
        break;
      }
      default: {
        dynamic_string err_msg(cVarArg, "Unsupported DDS FOURCC format: 0x%08X", desc.ddpfPixelFormat.dwFourCC);
        set_last_error(err_msg.get_ptr());
        return false;
      }
    }
  } else if ((desc.ddpfPixelFormat.dwRGBBitCount < 8) || (desc.ddpfPixelFormat.dwRGBBitCount > 32) || (desc.ddpfPixelFormat.dwRGBBitCount & 7)) {
    set_last_error("Unsupported bit count");
    return false;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_RGB) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
      if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
        m_format = PIXEL_FMT_A8L8;
      else
        m_format = PIXEL_FMT_L8;
    } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      m_format = PIXEL_FMT_A8R8G8B8;
    else
      m_format = PIXEL_FMT_R8G8B8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE)
      m_format = PIXEL_FMT_A8L8;
    else
      m_format = PIXEL_FMT_A8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
    m_format = PIXEL_FMT_L8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHA) {
    m_format = PIXEL_FMT_A8;
  } else {
    set_last_error("Unsupported format");
    return false;
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  uint bits_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    bits_per_pixel = pixel_format_helpers::get_bpp(m_format);

  set_last_error("Load failed");

  uint default_pitch;
  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    default_pitch = (((desc.dwWidth + 3) & ~3) * ((desc.dwHeight + 3) & ~3) * bits_per_pixel) >> 3;
  else
    default_pitch = (desc.dwWidth * bits_per_pixel) >> 3;

  uint pitch = 0;
  if ((desc.dwFlags & DDSD_PITCH) && (!(desc.dwFlags & DDSD_LINEARSIZE))) {
    pitch = desc.lPitch;
  }

  if (!pitch)
    pitch = default_pitch;
#if 0
      else if (pitch & 3)
      {
         // MS's DDS docs say the pitch must be DWORD aligned - but this isn't always the case.
         // ATI Compressonator writes images with non-DWORD aligned pitches, and the DDSWithoutD3DX sample from MS doesn't compute the proper DWORD aligned pitch when reading DDS
         // files, so the docs must be wrong/outdated.
         console::warning("DDS file's pitch is not divisible by 4 - trying to load anyway.");
      }
#endif
  // Check for obviously wacky source pitches (probably a corrupted/invalid file).
  else if (pitch > default_pitch * 8) {
    set_last_error("Invalid pitch");
    return false;
  }

  crnlib::vector<uint8> load_buf;

  uint mask_size[4];
  mask_size[0] = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
  mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
  mask_size[2] = math::bitmask_size(desc.ddpfPixelFormat.dwBBitMask);
  mask_size[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  uint mask_ofs[4];
  mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
  mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
  mask_ofs[2] = math::bitmask_ofs(desc.ddpfPixelFormat.dwBBitMask);
  mask_ofs[3] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  if ((desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) && (!mask_size[0])) {
    mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
    if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      mask_size[0] /= 2;
  }

  m_faces.resize(num_faces);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(desc.dwWidth >> level_index, 1U);
      const uint height = math::maximum<uint>(desc.dwHeight >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint actual_level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        const uint level_pitch = level_index ? actual_level_pitch : pitch;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == actual_level_pitch);

        if (!serializer.read(&pDXTImage->get_element_vec()[0], actual_level_pitch)) {
          crnlib_delete(pDXTImage);

          return false;
        }

        // DDS image in memory are always assumed to be little endian - the same as DDS itself.
        //if (c_crnlib_big_endian_platform)
        //   utils::endian_switch_words(reinterpret_cast<uint16*>(&pDXTImage->get_element_vec()[0]), actual_level_pitch / sizeof(uint16));

        if (level_pitch > actual_level_pitch) {
          if (!serializer.skip(level_pitch - actual_level_pitch)) {
            crnlib_delete(pDXTImage);

            return false;
          }
        }

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format);
      } else {
        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint bytes_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
        const uint actual_line_pitch = width * bytes_per_pixel;
        const uint line_pitch = level_index ? actual_line_pitch : pitch;

        if (load_buf.size() < line_pitch)
          load_buf.resize(line_pitch);

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          if (!serializer.read(&load_buf[0], line_pitch)) {
            crnlib_delete(pImage);
            return false;
          }

          color_quad_u8* pDst = pImage->get_scanline(y);

          for (uint x = 0; x < width; x++) {
            const uint8* pPixel = &load_buf[x * bytes_per_pixel];

            uint c = 0;
            // Assumes DDS is always little endian.
            for (uint l = 0; l < bytes_per_pixel; l++)
              c |= (pPixel[l] << (l * 8U));

            for (uint i = 0; i < 4; i++) {
              if (!mask_size[i])
                continue;

              uint mask = (1U << mask_size[i]) - 1U;
              uint bits = (c >> mask_ofs[i]) & mask;

              uint v = (bits * 255 + (mask >> 1)) / mask;

              q.set_component(i, v);
            }

            if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
              q.g = q.r;
              q.b = q.r;
            }

            *pDst++ = q;
          }
        }

        pMip->assign(pImage, m_format);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}